

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

void __thiscall io_buf::~io_buf(io_buf *this)

{
  v_array<int> *in_RDI;
  
  in_RDI->_begin = (int *)&PTR_open_file_00478310;
  v_array<int>::delete_v(in_RDI);
  v_array<char>::delete_v((v_array<char> *)in_RDI);
  return;
}

Assistant:

virtual ~io_buf()
  {
    files.delete_v();
    space.delete_v();
  }